

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

IterateResult __thiscall gl4cts::ShaderSubroutine::FunctionalTest11::iterate(FunctionalTest11 *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  GLuint GVar5;
  GLint GVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  size_t sVar7;
  NotSupportedError *this_00;
  char *pcVar8;
  char *__filename;
  FunctionalTest11 *this_01;
  long lVar9;
  GLuint *sampler_configuration;
  framebuffer framebuffer;
  texture color_texture;
  vertexArray vao;
  texture red_texture;
  texture blue_texture;
  program program;
  undefined1 local_1b0 [8];
  _Alloc_hider local_1a8;
  char local_1a0 [104];
  ios_base local_138 [264];
  
  if (iterate()::test_configurations == '\0') {
    iterate();
  }
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_shader_subroutine");
  if (bVar1) {
    framebuffer.m_context = (this->super_TestCase).m_context;
    blue_texture.m_id = 0;
    color_texture.m_id = 0;
    framebuffer.m_id = 0;
    program.m_tesselation_control_shader_id = 0;
    program.m_tesselation_evaluation_shader_id = 0;
    program.m_vertex_shader_id = 0;
    program.m_compute_shader_id = 0;
    program.m_fragment_shader_id = 0;
    program.m_geometry_shader_id = 0;
    program.m_program_object_id = 0;
    red_texture.m_id = 0;
    vao.m_id = 0;
    color_texture.m_context = framebuffer.m_context;
    vao.m_context = framebuffer.m_context;
    red_texture.m_context = framebuffer.m_context;
    blue_texture.m_context = framebuffer.m_context;
    program.m_context = framebuffer.m_context;
    Utils::program::build
              (&program,(GLchar *)0x0,
               "#version 400 core\n#extension GL_ARB_shader_subroutine : require\n\nprecision highp float;\n\n// Output\nlayout(location = 0) out vec4 out_color;\n\n// Global variables\nvec4 success_color;\nvec4 failure_color;\n\n// Samplers\nuniform sampler2D sampler_1;\nuniform sampler2D sampler_2;\n\n// Functions\nbool are_same(in vec4 left, in vec4 right)\n{\n    bvec4 result;\n\n    result.x = (left.x == right.x);\n    result.y = (left.y == right.y);\n    result.z = (left.z == right.z);\n    result.w = (left.w == right.w);\n\n    return all(result);\n}\n\nbool are_different(in vec4 left, in vec4 right)\n{\n    bvec4 result;\n\n    result.x = (left.x != right.x);\n    result.y = (left.y != right.y);\n    result.z = (left.z != right.z);\n    result.w = (left.w != right.w);\n\n    return any(result);\n}\n\n// Subroutine types\nsubroutine void discard_fragment_type(void);\nsubroutine void set_global_colors_type(void);\nsubroutine vec4 sample_texture_type(in vec2);\nsubroutine bool comparison_type(in vec4 left, in vec4 right);\nsubroutine void test_type(void);\n\n// Subroutine definitions\n// discard_fragment_type\nsubroutine(discard_fragment_type) void discard_yes(void)\n{\n    discard;\n}\n\nsubroutine(discard_fragment_type) void discard_no(void)\n{\n}\n\n// set_global_colors_type\nsubroutine(set_global_colors_type) void red_pass_blue_fail(void)\n{\n    success_color = vec4(1, 0, 0, 1);\n    failure_color = vec4(0, 0, 1, 1);\n}\n\nsubroutine(set_global_colors_type) void blue_pass_red_fail(void)\n{\n    success_color = vec4(0, 0, 1, 1);\n    failure_color = vec4(1, 0, 0, 1);\n}\n\n// sample_texture_type\nsubroutine(sample_texture_type) vec4 first_sampler(in vec2 coord)\n{\n    return texture(sampler_1, coord);\n}\n\nsubroutine(sample_texture_type) vec4 second_sampler(in vec2 coord)\n{\n    return texture(sampler_2, coord);\n}\n\n// comparison_type\nsubroutine(comparison_type) bool check_equal(in vec4 left, in vec4 right)\n{\n    return are_same(left, right);\n}\n\nsubroutine(comparison_type) bool check_not_equal(in vec4 left, in vec4 right)\n{\n    return are_different(left, right);\n}\n\n// Subroutine uniforms\nsubrouti..." /* TRUNCATED STRING LITERAL */
               ,
               "#version 400 core\n#extension GL_ARB_shader_subroutine : require\n\nprecision highp float;\n\nlayout(points)                           in;\nlayout(triangle_strip, max_vertices = 4) out;\n\nvoid main()\n{\n    gl_Position = vec4(-1, -1, 0, 1);\n    EmitVertex();\n    \n    gl_Position = vec4(-1,  1, 0, 1);\n    EmitVertex();\n    \n    gl_Position = vec4( 1, -1, 0, 1);\n    EmitVertex();\n    \n    gl_Position = vec4( 1,  1, 0, 1);\n    EmitVertex();\n    \n    EndPrimitive();\n}\n\n"
               ,(GLchar *)0x0,(GLchar *)0x0,
               "#version 400 core\n#extension GL_ARB_shader_subroutine : require\n\nprecision highp float;\n\nvoid main()\n{\n}\n\n"
               ,(GLchar **)0x0,0,false);
    iVar3 = (*(program.m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar3) + 0x1680))(program.m_program_object_id);
    dVar4 = (**(code **)(CONCAT44(extraout_var,iVar3) + 0x800))();
    glu::checkError(dVar4,"UseProgram",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x28f);
    Utils::vertexArray::generate(&vao);
    iVar3 = (*(vao.m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_00,iVar3) + 0xd8))(vao.m_id);
    dVar4 = (**(code **)(CONCAT44(extraout_var_00,iVar3) + 0x800))();
    glu::checkError(dVar4,"BindVertexArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x309);
    Utils::texture::create(&blue_texture,0x20,0x20,0x8058);
    Utils::texture::create(&color_texture,0x20,0x20,0x8058);
    Utils::texture::create(&red_texture,0x20,0x20,0x8058);
    Utils::framebuffer::generate(&framebuffer);
    iVar3 = (*(framebuffer.m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_01,iVar3) + 0x78))(0x8ca9,framebuffer.m_id);
    dVar4 = (**(code **)(CONCAT44(extraout_var_01,iVar3) + 0x800))();
    glu::checkError(dVar4,"BindFramebuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0xa6);
    Utils::framebuffer::attachTexture(&framebuffer,0x8ce0,color_texture.m_id,0x20,0x20);
    lVar9 = 0;
    do {
      GVar5 = Utils::program::getSubroutineIndex
                        (&program,*(GLchar **)((long)iterate::subroutine_names[0] + lVar9 * 2),
                         0x8b30);
      *(GLuint *)((long)this->m_subroutine_indices[0] + lVar9) = GVar5;
      GVar5 = Utils::program::getSubroutineIndex
                        (&program,*(GLchar **)((long)iterate::subroutine_names[0] + lVar9 * 2 + 8),
                         0x8b30);
      *(GLuint *)((long)this->m_subroutine_indices[0] + lVar9 + 4) = GVar5;
      lVar9 = lVar9 + 8;
    } while (lVar9 != 0x28);
    lVar9 = 0;
    do {
      GVar6 = Utils::program::getSubroutineUniformLocation
                        (&program,(GLchar *)
                                  ((long)&
                                         _ZZN6gl4cts16ShaderSubroutine16FunctionalTest117iterateEvE24subroutine_uniform_names_rel
                                  + (long)*(int *)((long)&
                                                  _ZZN6gl4cts16ShaderSubroutine16FunctionalTest117iterateEvE24subroutine_uniform_names_rel
                                                  + lVar9)),0x8b30);
      *(GLint *)((long)this->m_subroutine_uniform_locations + lVar9) = GVar6;
      lVar9 = lVar9 + 4;
    } while (lVar9 != 0x14);
    lVar9 = 0;
    do {
      this_01 = (FunctionalTest11 *)&program;
      GVar6 = Utils::program::getUniformLocation
                        (&program,(GLchar *)
                                  ((long)&
                                         _ZZN6gl4cts16ShaderSubroutine16FunctionalTest117iterateEvE13uniform_names_rel
                                  + (long)*(int *)((long)&
                                                  _ZZN6gl4cts16ShaderSubroutine16FunctionalTest117iterateEvE13uniform_names_rel
                                                  + lVar9)));
      *(GLint *)((long)this->m_uniform_locations + lVar9) = GVar6;
      lVar9 = lVar9 + 4;
    } while (lVar9 == 4);
    fillTexture(this_01,&blue_texture,"");
    fillTexture(this_01,&color_texture,"");
    fillTexture(this_01,&red_texture,iterate::red_color);
    this->m_source_textures[0] = blue_texture.m_id;
    this->m_source_textures[1] = red_texture.m_id;
    iVar3 = (*(framebuffer.m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_02,iVar3) + 0x1c0))(0,0,0,0);
    dVar4 = (**(code **)(CONCAT44(extraout_var_02,iVar3) + 0x800))();
    glu::checkError(dVar4,"ClearColor",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0xc1);
    bVar1 = true;
    sampler_configuration = iterate::test_configurations[0].m_samplers;
    lVar9 = 6;
    do {
      iVar3 = (*(framebuffer.m_context)->m_renderCtx->_vptr_RenderContext[3])();
      (**(code **)(CONCAT44(extraout_var_03,iVar3) + 0x188))(0x4000);
      dVar4 = (**(code **)(CONCAT44(extraout_var_03,iVar3) + 0x800))();
      glu::checkError(dVar4,"Clear",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0xb2);
      bVar2 = testDraw(this,sampler_configuration + -5,sampler_configuration,
                       (GLubyte *)(sampler_configuration + -6),&color_texture);
      if (!bVar2) {
        local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"Error. Failure for configuration: ",0x22);
        pcVar8 = ((testConfiguration *)(sampler_configuration + -8))->m_description;
        if (pcVar8 == (char *)0x0) {
          std::ios::clear((int)(ostringstream *)&local_1a8 +
                          (int)*(undefined8 *)(local_1a8._M_p + -0x18));
        }
        else {
          sVar7 = strlen(pcVar8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar8,sVar7);
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        bVar1 = false;
      }
      sampler_configuration = sampler_configuration + 10;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
    __filename = (char *)(ulong)((byte)~bVar1 & QP_TEST_RESULT_FAIL);
    pcVar8 = "Fail";
    if (bVar1) {
      pcVar8 = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               (byte)~bVar1 & QP_TEST_RESULT_FAIL,pcVar8);
    Utils::vertexArray::~vertexArray(&vao);
    Utils::texture::~texture(&red_texture);
    Utils::program::remove(&program,__filename);
    Utils::framebuffer::~framebuffer(&framebuffer);
    Utils::texture::~texture(&color_texture);
    Utils::texture::~texture(&blue_texture);
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_1b0 = (undefined1  [8])local_1a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b0,"GL_ARB_shader_subroutine is not supported.","");
  tcu::NotSupportedError::NotSupportedError(this_00,(string *)local_1b0);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult FunctionalTest11::iterate()
{
	static const GLchar* fragment_shader_code =
		"#version 400 core\n"
		"#extension GL_ARB_shader_subroutine : require\n"
		"\n"
		"precision highp float;\n"
		"\n"
		"// Output\n"
		"layout(location = 0) out vec4 out_color;\n"
		"\n"
		"// Global variables\n"
		"vec4 success_color;\n"
		"vec4 failure_color;\n"
		"\n"
		"// Samplers\n"
		"uniform sampler2D sampler_1;\n"
		"uniform sampler2D sampler_2;\n"
		"\n"
		"// Functions\n"
		"bool are_same(in vec4 left, in vec4 right)\n"
		"{\n"
		"    bvec4 result;\n"
		"\n"
		"    result.x = (left.x == right.x);\n"
		"    result.y = (left.y == right.y);\n"
		"    result.z = (left.z == right.z);\n"
		"    result.w = (left.w == right.w);\n"
		"\n"
		"    return all(result);\n"
		"}\n"
		"\n"
		"bool are_different(in vec4 left, in vec4 right)\n"
		"{\n"
		"    bvec4 result;\n"
		"\n"
		"    result.x = (left.x != right.x);\n"
		"    result.y = (left.y != right.y);\n"
		"    result.z = (left.z != right.z);\n"
		"    result.w = (left.w != right.w);\n"
		"\n"
		"    return any(result);\n"
		"}\n"
		"\n"
		"// Subroutine types\n"
		"subroutine void discard_fragment_type(void);\n"
		"subroutine void set_global_colors_type(void);\n"
		"subroutine vec4 sample_texture_type(in vec2);\n"
		"subroutine bool comparison_type(in vec4 left, in vec4 right);\n"
		"subroutine void test_type(void);\n"
		"\n"
		"// Subroutine definitions\n"
		"// discard_fragment_type\n"
		"subroutine(discard_fragment_type) void discard_yes(void)\n"
		"{\n"
		"    discard;\n"
		"}\n"
		"\n"
		"subroutine(discard_fragment_type) void discard_no(void)\n"
		"{\n"
		"}\n"
		"\n"
		"// set_global_colors_type\n"
		"subroutine(set_global_colors_type) void red_pass_blue_fail(void)\n"
		"{\n"
		"    success_color = vec4(1, 0, 0, 1);\n"
		"    failure_color = vec4(0, 0, 1, 1);\n"
		"}\n"
		"\n"
		"subroutine(set_global_colors_type) void blue_pass_red_fail(void)\n"
		"{\n"
		"    success_color = vec4(0, 0, 1, 1);\n"
		"    failure_color = vec4(1, 0, 0, 1);\n"
		"}\n"
		"\n"
		"// sample_texture_type\n"
		"subroutine(sample_texture_type) vec4 first_sampler(in vec2 coord)\n"
		"{\n"
		"    return texture(sampler_1, coord);\n"
		"}\n"
		"\n"
		"subroutine(sample_texture_type) vec4 second_sampler(in vec2 coord)\n"
		"{\n"
		"    return texture(sampler_2, coord);\n"
		"}\n"
		"\n"
		"// comparison_type\n"
		"subroutine(comparison_type) bool check_equal(in vec4 left, in vec4 right)\n"
		"{\n"
		"    return are_same(left, right);\n"
		"}\n"
		"\n"
		"subroutine(comparison_type) bool check_not_equal(in vec4 left, in vec4 right)\n"
		"{\n"
		"    return are_different(left, right);\n"
		"}\n"
		"\n"
		"// Subroutine uniforms\n"
		"subroutine uniform discard_fragment_type  discard_fragment;\n"
		"subroutine uniform set_global_colors_type set_global_colors;\n"
		"subroutine uniform sample_texture_type    sample_texture;\n"
		"subroutine uniform comparison_type        compare;\n"
		"\n"
		"// Subroutine definitions\n"
		"// test_type\n"
		"subroutine(test_type) void test_with_discard(void)\n"
		"{\n"
		"    discard_fragment();"
		"\n"
		"    out_color = failure_color;\n"
		"\n"
		"    set_global_colors();\n"
		"\n"
		"    vec4 sampled_color = sample_texture(gl_PointCoord);\n"
		"\n"
		"    bool comparison_result = compare(success_color, sampled_color);\n"
		"\n"
		"    if (true == comparison_result)\n"
		"    {\n"
		"        out_color = success_color;\n"
		"    }\n"
		"    else\n"
		"    {\n"
		"        out_color = failure_color;\n"
		"    }\n"
		"}\n"
		"\n"
		"subroutine(test_type) void test_without_discard(void)\n"
		"{\n"
		"    set_global_colors();\n"
		"\n"
		"    vec4 sampled_color = sample_texture(gl_PointCoord);\n"
		"\n"
		"    bool comparison_result = compare(success_color, sampled_color);\n"
		"\n"
		"    if (true == comparison_result)\n"
		"    {\n"
		"        out_color = success_color;\n"
		"    }\n"
		"    else\n"
		"    {\n"
		"        out_color = failure_color;\n"
		"    }\n"
		"}\n"
		"\n"
		"// Subroutine uniforms\n"
		"subroutine uniform test_type test;\n"
		"\n"
		"void main()\n"
		"{\n"
		"    // Set colors\n"
		"    success_color = vec4(0.5, 0.5, 0.5, 0.5);\n"
		"    failure_color = vec4(0.5, 0.5, 0.5, 0.5);\n"
		"\n"
		"    test();\n"
		"}\n"
		"\n";

	static const GLchar* geometry_shader_code = "#version 400 core\n"
												"#extension GL_ARB_shader_subroutine : require\n"
												"\n"
												"precision highp float;\n"
												"\n"
												"layout(points)                           in;\n"
												"layout(triangle_strip, max_vertices = 4) out;\n"
												"\n"
												"void main()\n"
												"{\n"
												"    gl_Position = vec4(-1, -1, 0, 1);\n"
												"    EmitVertex();\n"
												"    \n"
												"    gl_Position = vec4(-1,  1, 0, 1);\n"
												"    EmitVertex();\n"
												"    \n"
												"    gl_Position = vec4( 1, -1, 0, 1);\n"
												"    EmitVertex();\n"
												"    \n"
												"    gl_Position = vec4( 1,  1, 0, 1);\n"
												"    EmitVertex();\n"
												"    \n"
												"    EndPrimitive();\n"
												"}\n"
												"\n";

	static const GLchar* vertex_shader_code = "#version 400 core\n"
											  "#extension GL_ARB_shader_subroutine : require\n"
											  "\n"
											  "precision highp float;\n"
											  "\n"
											  "void main()\n"
											  "{\n"
											  "}\n"
											  "\n";

	static const GLchar* subroutine_names[][2] = { { "discard_yes", "discard_no" },
												   { "red_pass_blue_fail", "blue_pass_red_fail" },
												   { "first_sampler", "second_sampler" },
												   { "check_equal", "check_not_equal" },
												   { "test_with_discard", "test_without_discard" } };
	static const GLuint n_subroutine_types = sizeof(subroutine_names) / sizeof(subroutine_names[0]);

	static const GLchar* subroutine_uniform_names[] = { "discard_fragment", "set_global_colors", "sample_texture",
														"compare", "test" };
	static const GLuint n_subroutine_uniform_names =
		sizeof(subroutine_uniform_names) / sizeof(subroutine_uniform_names[0]);

	static const GLchar* uniform_names[] = {
		"sampler_1", "sampler_2",
	};
	static const GLuint n_uniform_names = sizeof(uniform_names) / sizeof(uniform_names[0]);

	/* Colors */
	static const GLubyte blue_color[4]  = { 0, 0, 255, 255 };
	static const GLubyte clean_color[4] = { 0, 0, 0, 0 };
	static const GLubyte red_color[4]   = { 255, 0, 0, 255 };

	/* Configurations */
	static const testConfiguration test_configurations[] = {
		testConfiguration(
			"Expect red color from 1st sampler", red_color, 1 /* discard_fragment  : discard_no         */,
			0 /* set_global_colors : red_pass_blue_fail */, 0 /* sample_texture    : first_sampler      */,
			0 /* compare           : check_equal        */, 0 /* test              : test_with_discard  */, 1 /* red */,
			0 /* blue */),

		testConfiguration(
			"Test \"without discard\" option, expect no blue color from 2nd sampler", blue_color,
			0 /* discard_fragment  : discard_yes           */, 1 /* set_global_colors : blue_pass_red_fail    */,
			1 /* sample_texture    : second_sampler        */, 1 /* compare           : check_not_equal       */,
			1 /* test              : test_without_discard  */, 0 /* blue */, 1 /* red */),

		testConfiguration("Fragment shoud be discarded", clean_color, 0 /* discard_fragment  : discard_yes        */,
						  0 /* set_global_colors : red_pass_blue_fail */,
						  0 /* sample_texture    : first_sampler      */,
						  0 /* compare           : check_equal        */,
						  0 /* test              : test_with_discard  */, 1 /* red */, 0 /* blue */),

		testConfiguration(
			"Expect blue color from 1st sampler", blue_color, 1 /* discard_fragment  : discard_no         */,
			1 /* set_global_colors : blue_pass_red_fail */, 0 /* sample_texture    : first_sampler      */,
			0 /* compare           : check_equal        */, 0 /* test              : test_with_discard  */,
			0 /* blue */, 1 /* red */),

		testConfiguration(
			"Expect red color from 2nd sampler", red_color, 1 /* discard_fragment  : discard_no         */,
			0 /* set_global_colors : red_pass_blue_fail */, 1 /* sample_texture    : second_sampler     */,
			0 /* compare           : check_equal        */, 0 /* test              : test_with_discard  */,
			0 /* blue */, 1 /* red */),

		testConfiguration(
			"Expect no blue color from 2nd sampler", blue_color, 1 /* discard_fragment  : discard_no         */,
			1 /* set_global_colors : blue_pass_red_fail */, 1 /* sample_texture    : second_sampler     */,
			1 /* compare           : check_not_equal    */, 0 /* test              : test_with_discard  */,
			0 /* blue */, 1 /* red */),
	};
	static const GLuint n_test_cases = sizeof(test_configurations) / sizeof(test_configurations[0]);

	/* Do not execute the test if GL_ARB_shader_subroutine is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_subroutine"))
	{
		throw tcu::NotSupportedError("GL_ARB_shader_subroutine is not supported.");
	}

	/* GL objects */
	Utils::texture	 blue_texture(m_context);
	Utils::texture	 color_texture(m_context);
	Utils::framebuffer framebuffer(m_context);
	Utils::program	 program(m_context);
	Utils::texture	 red_texture(m_context);
	Utils::vertexArray vao(m_context);

	/* Init GL objects */
	program.build(0 /* cs */, fragment_shader_code /* fs */, geometry_shader_code /* gs */, 0 /* tcs */, 0 /* test */,
				  vertex_shader_code, 0 /* varying_names */, 0 /* n_varyings */);

	program.use();

	vao.generate();
	vao.bind();

	blue_texture.create(m_texture_width, m_texture_height, GL_RGBA8);
	color_texture.create(m_texture_width, m_texture_height, GL_RGBA8);
	red_texture.create(m_texture_width, m_texture_height, GL_RGBA8);

	framebuffer.generate();
	framebuffer.bind();
	framebuffer.attachTexture(GL_COLOR_ATTACHMENT0, color_texture.m_id, m_texture_width, m_texture_height);

	/* Get subroutine indices */
	for (GLuint type = 0; type < n_subroutine_types; ++type)
	{
		m_subroutine_indices[type][0] = program.getSubroutineIndex(subroutine_names[type][0], GL_FRAGMENT_SHADER);
		m_subroutine_indices[type][1] = program.getSubroutineIndex(subroutine_names[type][1], GL_FRAGMENT_SHADER);
	}

	/* Get subroutine uniform locations */
	for (GLuint uniform = 0; uniform < n_subroutine_uniform_names; ++uniform)
	{
		m_subroutine_uniform_locations[uniform] =
			program.getSubroutineUniformLocation(subroutine_uniform_names[uniform], GL_FRAGMENT_SHADER);
	}

	/* Get uniform locations */
	for (GLuint i = 0; i < n_uniform_names; ++i)
	{
		m_uniform_locations[i] = program.getUniformLocation(uniform_names[i]);
	}

	/* Prepare textures */
	fillTexture(blue_texture, blue_color);
	fillTexture(color_texture, clean_color);
	fillTexture(red_texture, red_color);

	m_source_textures[0] = blue_texture.m_id;
	m_source_textures[1] = red_texture.m_id;

	framebuffer.clearColor(0.0f, 0.0f, 0.0f, 0.0f);

	/* Test */
	bool result = true;
	for (GLuint i = 0; i < n_test_cases; ++i)
	{
		/* Clean output texture */
		framebuffer.clear(GL_COLOR_BUFFER_BIT);

		/* Execute test */
		if (false == testDraw(test_configurations[i].m_routines, test_configurations[i].m_samplers,
							  test_configurations[i].m_expected_color, color_texture))
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Error. Failure for configuration: " << test_configurations[i].m_description
				<< tcu::TestLog::EndMessage;

			result = false;
		}
	}

	/* Set result */
	if (true == result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}